

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

void icu_63::Format::syntaxError(UnicodeString *pattern,int32_t pos,UParseError *parseError)

{
  UnicodeString *this;
  int iVar1;
  int32_t iVar2;
  int local_70;
  int local_4c;
  Char16Ptr local_48 [3];
  Char16Ptr local_30;
  int32_t local_28;
  int local_24;
  int32_t stop;
  int32_t start;
  UParseError *parseError_local;
  UnicodeString *pUStack_10;
  int32_t pos_local;
  UnicodeString *pattern_local;
  
  parseError->offset = pos;
  parseError->line = 0;
  if (pos < 0x10) {
    local_4c = 0;
  }
  else {
    local_4c = pos + -0xf;
  }
  local_24 = local_4c;
  local_28 = pos;
  _stop = parseError;
  parseError_local._4_4_ = pos;
  pUStack_10 = pattern;
  Char16Ptr::Char16Ptr(&local_30,parseError->preContext);
  UnicodeString::extract(pattern,local_4c,pos - local_4c,&local_30,0);
  Char16Ptr::~Char16Ptr(&local_30);
  _stop->preContext[local_28 - local_24] = L'\0';
  local_24 = parseError_local._4_4_ + 1;
  iVar1 = parseError_local._4_4_ + 0x10;
  iVar2 = UnicodeString::length(pUStack_10);
  if (iVar2 < iVar1) {
    local_70 = UnicodeString::length(pUStack_10);
  }
  else {
    local_70 = parseError_local._4_4_ + 0xf;
  }
  this = pUStack_10;
  iVar1 = local_24;
  local_28 = local_70;
  local_70 = local_70 - local_24;
  Char16Ptr::Char16Ptr(local_48,_stop->postContext);
  UnicodeString::extract(this,iVar1,local_70,local_48,0);
  Char16Ptr::~Char16Ptr(local_48);
  _stop->postContext[local_28 - local_24] = L'\0';
  return;
}

Assistant:

void Format::syntaxError(const UnicodeString& pattern,
                         int32_t pos,
                         UParseError& parseError) {
    parseError.offset = pos;
    parseError.line=0;  // we are not using line number

    // for pre-context
    int32_t start = (pos < U_PARSE_CONTEXT_LEN)? 0 : (pos - (U_PARSE_CONTEXT_LEN-1
                                                             /* subtract 1 so that we have room for null*/));
    int32_t stop  = pos;
    pattern.extract(start,stop-start,parseError.preContext,0);
    //null terminate the buffer
    parseError.preContext[stop-start] = 0;

    //for post-context
    start = pos+1;
    stop  = ((pos+U_PARSE_CONTEXT_LEN)<=pattern.length()) ? (pos+(U_PARSE_CONTEXT_LEN-1)) :
        pattern.length();
    pattern.extract(start,stop-start,parseError.postContext,0);
    //null terminate the buffer
    parseError.postContext[stop-start]= 0;
}